

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram.cpp
# Opt level: O0

void __thiscall QNetworkDatagram::QNetworkDatagram(QNetworkDatagram *this)

{
  QNetworkDatagramPrivate *this_00;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  quint16 in_stack_ffffffffffffffae;
  QHostAddress *this_01;
  QByteArray *data;
  QHostAddress local_28;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkDatagramPrivate *)operator_new(0x40);
  data = &local_20;
  QByteArray::QByteArray((QByteArray *)0x22fc63);
  this_01 = &local_28;
  QHostAddress::QHostAddress(this_01);
  QNetworkDatagramPrivate::QNetworkDatagramPrivate(this_00,data,this_01,in_stack_ffffffffffffffae);
  QHostAddress::~QHostAddress((QHostAddress *)0x22fc92);
  QByteArray::~QByteArray((QByteArray *)0x22fc9c);
  *in_RDI = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkDatagram::QNetworkDatagram()
    : d(new QNetworkDatagramPrivate)
{
}